

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O1

int EC_POINT_set_to_infinity(EC_GROUP *group,EC_POINT *point)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)group + 0x70);
  if ((UNRECOVERED_JUMPTABLE != (code *)0x0) && (*(long *)group == *(long *)point)) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)();
    return iVar1;
  }
  return 0;
}

Assistant:

int EC_POINT_set_to_infinity(const EC_GROUP *group, EC_POINT *point)
{
    if (group->meth->point_set_to_infinity == 0) {
        //ECerr(EC_F_EC_POINT_SET_TO_INFINITY,
            //   ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return 0;
    }
    if (group->meth != point->meth) {
        //ECerr(EC_F_EC_POINT_SET_TO_INFINITY, EC_R_INCOMPATIBLE_OBJECTS);
        return 0;
    }
    return group->meth->point_set_to_infinity(group, point);
}